

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

void hat_widget(nk_context *nk,uchar state)

{
  nk_widget_layout_states nVar1;
  nk_color c;
  nk_command_buffer *pnVar2;
  float fVar3;
  float fVar4;
  nk_vec2 nVar5;
  nk_vec2 nVar6;
  nk_vec2 nVar7;
  nk_rect r;
  float local_b0;
  float local_a8;
  float fStack_a4;
  nk_vec2 p2;
  nk_vec2 p1;
  nk_vec2 p0;
  float sina;
  float cosa;
  float angles [14];
  float local_30;
  float fStack_2c;
  nk_vec2 center;
  nk_rect area;
  float radius;
  uchar state_local;
  nk_context *nk_local;
  
  nVar1 = nk_widget((nk_rect *)&center,nk);
  if (nVar1 != NK_WIDGET_INVALID) {
    nVar5 = nk_vec2(center.x + area.x * 0.5,center.y + area.y * 0.5);
    if (area.y <= area.x) {
      local_b0 = area.y;
    }
    else {
      local_b0 = area.x;
    }
    local_b0 = local_b0 * 0.5;
    pnVar2 = nk_window_get_canvas(nk);
    local_30 = nVar5.x;
    fStack_2c = nVar5.y;
    r = nk_rect(local_30 - local_b0,fStack_2c - local_b0,local_b0 + local_b0,local_b0 + local_b0);
    angles[0xd] = (float)nk_rgb(0xaf,0xaf,0xaf);
    nk_stroke_circle(pnVar2,r,1.0,(nk_color)angles[0xd]);
    if (state != '\0') {
      angles[6] = 1.5707964;
      angles[7] = 0.7853982;
      angles[8] = 0.0;
      angles[9] = 0.0;
      angles[2] = 3.1415927;
      angles[3] = 0.0;
      angles[4] = 3.926991;
      angles[5] = 0.0;
      _sina = 0;
      angles[0] = 4.712389;
      angles[1] = 5.4977875;
      angles[10] = 2.3561945;
      angles[0xb] = 0.0;
      fVar3 = nk_cos((&sina)[state]);
      fVar4 = nk_sin((&sina)[state]);
      nVar5 = nk_vec2(0.0,-local_b0);
      nVar6 = nk_vec2(local_b0 * 0.5,-local_b0 / 3.0);
      nVar7 = nk_vec2(local_b0 * -0.5,-local_b0 / 3.0);
      pnVar2 = nk_window_get_canvas(nk);
      p1.x = nVar5.x;
      p1.y = nVar5.y;
      p2.x = nVar6.x;
      p2.y = nVar6.y;
      local_a8 = nVar7.x;
      fStack_a4 = nVar7.y;
      c = nk_rgb(0xaf,0xaf,0xaf);
      nk_fill_triangle(pnVar2,fVar4 * p1.y + fVar3 * p1.x + local_30,
                       -fVar4 * p1.x + fVar3 * p1.y + fStack_2c,
                       fVar4 * p2.y + fVar3 * p2.x + local_30,
                       -fVar4 * p2.x + fVar3 * p2.y + fStack_2c,
                       fVar4 * fStack_a4 + fVar3 * local_a8 + local_30,
                       -fVar4 * local_a8 + fVar3 * fStack_a4 + fStack_2c,c);
    }
  }
  return;
}

Assistant:

static void hat_widget(struct nk_context* nk, unsigned char state)
{
    float radius;
    struct nk_rect area;
    struct nk_vec2 center;

    if (nk_widget(&area, nk) == NK_WIDGET_INVALID)
        return;

    center = nk_vec2(area.x + area.w / 2.f, area.y + area.h / 2.f);
    radius = NK_MIN(area.w, area.h) / 2.f;

    nk_stroke_circle(nk_window_get_canvas(nk),
                     nk_rect(center.x - radius,
                             center.y - radius,
                             radius * 2.f,
                             radius * 2.f),
                     1.f,
                     nk_rgb(175, 175, 175));

    if (state)
    {
        const float angles[] =
        {
            0.f,           0.f,
            NK_PI * 1.5f,  NK_PI * 1.75f,
            NK_PI,         0.f,
            NK_PI * 1.25f, 0.f,
            NK_PI * 0.5f,  NK_PI * 0.25f,
            0.f,           0.f,
            NK_PI * 0.75f, 0.f,
        };
        const float cosa = nk_cos(angles[state]);
        const float sina = nk_sin(angles[state]);
        const struct nk_vec2 p0 = nk_vec2(0.f, -radius);
        const struct nk_vec2 p1 = nk_vec2( radius / 2.f, -radius / 3.f);
        const struct nk_vec2 p2 = nk_vec2(-radius / 2.f, -radius / 3.f);

        nk_fill_triangle(nk_window_get_canvas(nk),
                         center.x + cosa * p0.x + sina * p0.y,
                         center.y + cosa * p0.y - sina * p0.x,
                         center.x + cosa * p1.x + sina * p1.y,
                         center.y + cosa * p1.y - sina * p1.x,
                         center.x + cosa * p2.x + sina * p2.y,
                         center.y + cosa * p2.y - sina * p2.x,
                         nk_rgb(175, 175, 175));
    }
}